

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void reset_weak_ref(JSRuntime *rt,JSObject *p)

{
  int *piVar1;
  int iVar2;
  list_head *plVar3;
  list_head *plVar4;
  JSMapRecord *pJVar5;
  JSValue v;
  JSMapRecord *pJVar6;
  
  for (pJVar6 = p->first_weak_ref; pJVar6 != (JSMapRecord *)0x0; pJVar6 = pJVar6->next_weak_ref) {
    plVar3 = (pJVar6->hash_link).prev;
    plVar4 = (pJVar6->hash_link).next;
    plVar3->next = plVar4;
    plVar4->prev = plVar3;
    (pJVar6->hash_link).prev = (list_head *)0x0;
    (pJVar6->hash_link).next = (list_head *)0x0;
    plVar3 = (pJVar6->link).prev;
    plVar4 = (pJVar6->link).next;
    plVar3->next = plVar4;
    plVar4->prev = plVar3;
    (pJVar6->link).prev = (list_head *)0x0;
    (pJVar6->link).next = (list_head *)0x0;
  }
  if (p->first_weak_ref != (JSMapRecord *)0x0) {
    pJVar6 = p->first_weak_ref;
    do {
      pJVar5 = pJVar6->next_weak_ref;
      piVar1 = (int *)(pJVar6->value).u.ptr;
      v = pJVar6->value;
      if ((0xfffffff4 < (uint)(pJVar6->value).tag) &&
         (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(rt,v);
      }
      (*(rt->mf).js_free)(&rt->malloc_state,pJVar6);
      pJVar6 = pJVar5;
    } while (pJVar5 != (JSMapRecord *)0x0);
  }
  p->first_weak_ref = (JSMapRecord *)0x0;
  return;
}

Assistant:

static void reset_weak_ref(JSRuntime *rt, JSObject *p)
{
    JSMapRecord *mr, *mr_next;
    JSMapState *s;
    
    /* first pass to remove the records from the WeakMap/WeakSet
       lists */
    for(mr = p->first_weak_ref; mr != NULL; mr = mr->next_weak_ref) {
        s = mr->map;
        assert(s->is_weak);
        assert(!mr->empty); /* no iterator on WeakMap/WeakSet */
        list_del(&mr->hash_link);
        list_del(&mr->link);
    }
    
    /* second pass to free the values to avoid modifying the weak
       reference list while traversing it. */
    for(mr = p->first_weak_ref; mr != NULL; mr = mr_next) {
        mr_next = mr->next_weak_ref;
        JS_FreeValueRT(rt, mr->value);
        js_free_rt(rt, mr);
    }

    p->first_weak_ref = NULL; /* fail safe */
}